

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

_Bool get_ini_data(OpenJTalk *oj)

{
  _Bool _Var1;
  size_t sVar2;
  ConfigScanner *sc_00;
  long in_RDI;
  double temp_double;
  int temp_int;
  char *temp;
  ConfigScanner *sc;
  char *in_stack_00000300;
  OpenJTalk *in_stack_00000308;
  char *in_stack_00000410;
  OpenJTalk *in_stack_00000418;
  undefined4 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  OpenJTalk *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  ConfigScanner *in_stack_ffffffffffffffe0;
  _Bool local_1;
  
  sVar2 = strlen(g_ini_path);
  if (sVar2 == 0) {
    local_1 = false;
  }
  else {
    if ((g_verbose & 1U) != 0) {
      console_message((char *)0x19277d);
    }
    sc_00 = config_load(in_stack_ffffffffffffffd8);
    if (sc_00 == (ConfigScanner *)0x0) {
      local_1 = false;
    }
    else {
      _Var1 = config_find_string(sc_00,(char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                                 (char **)in_stack_ffffffffffffffd0);
      if (_Var1) {
        sVar2 = strlen((char *)(in_RDI + 0x10c));
        if (sVar2 == 0) {
          if ((g_verbose & 1U) != 0) {
            console_message_string
                      ((char *)in_stack_ffffffffffffffd0,
                       (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
          }
          set_config_voice_dir(in_stack_00000308,in_stack_00000300);
        }
        else if ((g_verbose & 1U) != 0) {
          console_message((char *)0x192823);
        }
      }
      _Var1 = config_find_string(sc_00,(char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                                 (char **)in_stack_ffffffffffffffd0);
      if (_Var1) {
        sVar2 = strlen((char *)(in_RDI + 8));
        if (sVar2 == 0) {
          _Var1 = set_config_dic_dir(in_stack_00000418,in_stack_00000410);
          if ((!_Var1) && ((g_verbose & 1U) != 0)) {
            console_message((char *)0x19288c);
          }
        }
        else if ((g_verbose & 1U) != 0) {
          console_message((char *)0x1928a8);
        }
      }
      _Var1 = config_find_string(sc_00,(char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                                 (char **)in_stack_ffffffffffffffd0);
      if (_Var1) {
        sVar2 = strlen((char *)(in_RDI + 0x210));
        if (sVar2 == 0) {
          if ((g_verbose & 1U) != 0) {
            console_message_string
                      ((char *)in_stack_ffffffffffffffd0,
                       (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
          }
          set_config_voice(in_stack_00000418,in_stack_00000410);
        }
        else if ((g_verbose & 1U) != 0) {
          console_message((char *)0x19292f);
        }
      }
      _Var1 = config_find_integer(sc_00,(char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                                  (int *)in_stack_ffffffffffffffd0);
      if (_Var1) {
        if ((g_verbose & 1U) != 0) {
          console_message_integer((char *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
        }
        openjtalk_setSamplingFrequency(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
      }
      _Var1 = config_find_integer(sc_00,(char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                                  (int *)in_stack_ffffffffffffffd0);
      if (_Var1) {
        if ((g_verbose & 1U) != 0) {
          console_message_integer((char *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
        }
        openjtalk_setSamplingFrequency(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
      }
      _Var1 = config_find_integer(sc_00,(char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                                  (int *)in_stack_ffffffffffffffd0);
      if (_Var1) {
        if ((g_verbose & 1U) != 0) {
          console_message_integer((char *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
        }
        openjtalk_setFperiod(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
      }
      _Var1 = config_find_integer(sc_00,(char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                                  (int *)in_stack_ffffffffffffffd0);
      if (_Var1) {
        if ((g_verbose & 1U) != 0) {
          console_message_integer((char *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
        }
        openjtalk_setFperiod(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
      }
      _Var1 = config_find_double(sc_00,(char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                                 (double *)in_stack_ffffffffffffffd0);
      if (_Var1) {
        if ((g_verbose & 1U) != 0) {
          console_message_float
                    ((char *)in_stack_ffffffffffffffd0,
                     (double)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        }
        openjtalk_setAlpha(in_stack_ffffffffffffffd0,
                           (double)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      }
      _Var1 = config_find_double(sc_00,(char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                                 (double *)in_stack_ffffffffffffffd0);
      if (_Var1) {
        if ((g_verbose & 1U) != 0) {
          console_message_float
                    ((char *)in_stack_ffffffffffffffd0,
                     (double)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        }
        openjtalk_setAlpha(in_stack_ffffffffffffffd0,
                           (double)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      }
      _Var1 = config_find_double(sc_00,(char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                                 (double *)in_stack_ffffffffffffffd0);
      if (_Var1) {
        if ((g_verbose & 1U) != 0) {
          console_message_float
                    ((char *)in_stack_ffffffffffffffd0,
                     (double)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        }
        openjtalk_setBeta(in_stack_ffffffffffffffd0,
                          (double)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      }
      _Var1 = config_find_double(sc_00,(char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                                 (double *)in_stack_ffffffffffffffd0);
      if (_Var1) {
        if ((g_verbose & 1U) != 0) {
          console_message_float
                    ((char *)in_stack_ffffffffffffffd0,
                     (double)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        }
        openjtalk_setBeta(in_stack_ffffffffffffffd0,
                          (double)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      }
      _Var1 = config_find_double(sc_00,(char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                                 (double *)in_stack_ffffffffffffffd0);
      if (_Var1) {
        if ((g_verbose & 1U) != 0) {
          console_message_float
                    ((char *)in_stack_ffffffffffffffd0,
                     (double)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        }
        openjtalk_setSpeed(in_stack_ffffffffffffffd0,
                           (double)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      }
      _Var1 = config_find_double(sc_00,(char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                                 (double *)in_stack_ffffffffffffffd0);
      if (_Var1) {
        if ((g_verbose & 1U) != 0) {
          console_message_float
                    ((char *)in_stack_ffffffffffffffd0,
                     (double)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        }
        openjtalk_setSpeed(in_stack_ffffffffffffffd0,
                           (double)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      }
      _Var1 = config_find_double(sc_00,(char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                                 (double *)in_stack_ffffffffffffffd0);
      if (_Var1) {
        if ((g_verbose & 1U) != 0) {
          console_message_float
                    ((char *)in_stack_ffffffffffffffd0,
                     (double)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        }
        openjtalk_setAdditionalHalfTone
                  (in_stack_ffffffffffffffd0,
                   (double)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      }
      _Var1 = config_find_double(sc_00,(char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                                 (double *)in_stack_ffffffffffffffd0);
      if (_Var1) {
        if ((g_verbose & 1U) != 0) {
          console_message_float
                    ((char *)in_stack_ffffffffffffffd0,
                     (double)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        }
        openjtalk_setAdditionalHalfTone
                  (in_stack_ffffffffffffffd0,
                   (double)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      }
      _Var1 = config_find_double(sc_00,(char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                                 (double *)in_stack_ffffffffffffffd0);
      if (_Var1) {
        if ((g_verbose & 1U) != 0) {
          console_message_float
                    ((char *)in_stack_ffffffffffffffd0,
                     (double)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        }
        openjtalk_setMsdThreshold
                  (in_stack_ffffffffffffffd0,
                   (double)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      }
      _Var1 = config_find_double(sc_00,(char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                                 (double *)in_stack_ffffffffffffffd0);
      if (_Var1) {
        if ((g_verbose & 1U) != 0) {
          console_message_integer((char *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
        }
        openjtalk_setMsdThreshold
                  (in_stack_ffffffffffffffd0,
                   (double)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      }
      _Var1 = config_find_double(sc_00,(char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                                 (double *)in_stack_ffffffffffffffd0);
      if (_Var1) {
        if ((g_verbose & 1U) != 0) {
          console_message_float
                    ((char *)in_stack_ffffffffffffffd0,
                     (double)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        }
        openjtalk_setGvWeightForSpectrum
                  (in_stack_ffffffffffffffd0,
                   (double)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      }
      _Var1 = config_find_double(sc_00,(char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                                 (double *)in_stack_ffffffffffffffd0);
      if (_Var1) {
        if ((g_verbose & 1U) != 0) {
          console_message_float
                    ((char *)in_stack_ffffffffffffffd0,
                     (double)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        }
        openjtalk_setGvWeightForSpectrum
                  (in_stack_ffffffffffffffd0,
                   (double)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      }
      _Var1 = config_find_double(sc_00,(char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                                 (double *)in_stack_ffffffffffffffd0);
      if (_Var1) {
        if ((g_verbose & 1U) != 0) {
          console_message_float
                    ((char *)in_stack_ffffffffffffffd0,
                     (double)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        }
        openjtalk_setGvWeightForLogF0
                  (in_stack_ffffffffffffffd0,
                   (double)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      }
      _Var1 = config_find_double(sc_00,(char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                                 (double *)in_stack_ffffffffffffffd0);
      if (_Var1) {
        if ((g_verbose & 1U) != 0) {
          console_message_float
                    ((char *)in_stack_ffffffffffffffd0,
                     (double)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        }
        openjtalk_setGvWeightForLogF0
                  (in_stack_ffffffffffffffd0,
                   (double)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      }
      _Var1 = config_find_double(sc_00,(char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                                 (double *)in_stack_ffffffffffffffd0);
      if (_Var1) {
        if ((g_verbose & 1U) != 0) {
          console_message_float
                    ((char *)in_stack_ffffffffffffffd0,
                     (double)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        }
        openjtalk_setVolume(in_stack_ffffffffffffffd0,
                            (double)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      }
      _Var1 = config_find_double(sc_00,(char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                                 (double *)in_stack_ffffffffffffffd0);
      if (_Var1) {
        if ((g_verbose & 1U) != 0) {
          console_message_float
                    ((char *)in_stack_ffffffffffffffd0,
                     (double)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        }
        openjtalk_setVolume(in_stack_ffffffffffffffd0,
                            (double)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      }
      config_free(in_stack_ffffffffffffffe0);
      if ((g_verbose & 1U) != 0) {
        console_message((char *)0x192fd5);
      }
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool get_ini_data(OpenJTalk *oj)
{
	if (strlen(g_ini_path) == 0)
	{
		return false;
	}

	if (g_verbose)
	{
		console_message(u8"***** 設定ファイル解釈　開始 *****\n");
	}

	ConfigScanner *sc = config_load(g_ini_path);
	if (sc == NULL)
	{
		return false;
	}

	char *temp;
	if (config_find_string(sc, G_SECTION_NAME, u8"voice_dir", &temp))
	{
		if (strlen(oj->dn_voice_dir_path) == 0)
		{
			if (g_verbose)
			{
				console_message_string(u8"config voice_dir： %s\n", temp);
			}
			set_config_voice_dir(oj, temp);
		}
		else
		{
			if (g_verbose)
			{
				console_message(u8"config voice_dir: 無視\n");
			}
		}
	}

	if (config_find_string(sc, G_SECTION_NAME, u8"dic_dir", &temp))
	{
		if (strlen(oj->dn_dic_path) == 0)
		{
			if (!set_config_dic_dir(oj, temp))
			{
				if (g_verbose)
				{
					console_message(u8"warning: 設定ファイルからの辞書ファイルの設定に失敗しました。\n");
				}
			}
		}
		else
		{
			if (g_verbose)
			{
				console_message(u8"config dic_dir: 無視\n");
			}
		}
	}

	if (config_find_string(sc, G_SECTION_NAME, u8"voice", &temp))
	{
		if (strlen(oj->fn_voice_path) == 0)
		{
			if (g_verbose)
			{
				console_message_string(u8"config voice： %s\n", temp);
			}
			set_config_voice(oj, temp);
		}
		else
		{
			if (g_verbose)
			{
				console_message(u8"config voice: 無視\n");
			}
		}
	}

	int temp_int;
	if (config_find_integer(sc, G_SECTION_NAME, u8"sampling_frequency", &temp_int))
	{
		if (g_verbose)
		{
			console_message_integer(u8"config sampling_frequency: %d\n", temp_int);
		}
		openjtalk_setSamplingFrequency(oj, temp_int);
	}
	if (config_find_integer(sc, G_SECTION_NAME, u8"s", &temp_int))
	{
		if (g_verbose)
		{
			console_message_integer(u8"config s: %d\n", temp_int);
		}
		openjtalk_setSamplingFrequency(oj, temp_int);
	}
	if (config_find_integer(sc, G_SECTION_NAME, u8"fperiod", &temp_int))
	{
		if (g_verbose)
		{
			console_message_integer(u8"config fperiod: %d\n", temp_int);
		}
		openjtalk_setFperiod(oj, temp_int);
	}
	if (config_find_integer(sc, G_SECTION_NAME, u8"p", &temp_int))
	{
		if (g_verbose)
		{
			console_message_integer(u8"config p: %d\n", temp_int);
		}
		openjtalk_setFperiod(oj, temp_int);
	}

	double temp_double;
	if (config_find_double(sc, G_SECTION_NAME, u8"alpha", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config alpha: %f\n", temp_double);
		}
		openjtalk_setAlpha(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"a", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config a: %f\n", temp_double);
		}
		openjtalk_setAlpha(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"beta", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config beta: %f\n", temp_double);
		}
		openjtalk_setBeta(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"b", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config b: %f\n", temp_double);
		}
		openjtalk_setBeta(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"speed", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config speed: %f\n", temp_double);
		}
		openjtalk_setSpeed(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"r", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config r: %f\n", temp_double);
		}
		openjtalk_setSpeed(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"additional_half_tone", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config additional_half_tone: %f\n", temp_double);
		}
		openjtalk_setAdditionalHalfTone(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"fm", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config fm: %f\n", temp_double);
		}
		openjtalk_setAdditionalHalfTone(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"msd_threshold", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config msd_threshold: %f\n", temp_double);
		}
		openjtalk_setMsdThreshold(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"u", &temp_double))
	{
		if (g_verbose)
		{
			console_message_integer(u8"config u: %f\n", temp_double);
		}
		openjtalk_setMsdThreshold(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"gv_weight_for_spectrum", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config gv_weight_for_spectrum: %f\n", temp_double);
		}
		openjtalk_setGvWeightForSpectrum(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"jm", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config jm： %f\n", temp_double);
		}
		openjtalk_setGvWeightForSpectrum(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"gv_weight_for_log_f0", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config gv_weight_for_log_f0: %f\n", temp_double);
		}
		openjtalk_setGvWeightForLogF0(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"jf", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config jf: %f\n", temp_double);
		}
		openjtalk_setGvWeightForLogF0(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"volume", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config volume: %f\n", temp_double);
		}
		openjtalk_setVolume(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"g", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config g: %f\n", temp_double);
		}
		openjtalk_setVolume(oj, temp_double);
	}
	config_free(sc);
	if (g_verbose)
	{
		console_message(u8"***** 設定ファイル解釈　終了 *****\n");
	}
	return true;
}